

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O2

void __thiscall mesh<double>::mesh(mesh<double> *this,string *file,shared_ptr<material<double>_> *m)

{
  vector<vec3<double>,_std::allocator<vec3<double>_>_> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  reference __args_1;
  reference __args_2;
  reference __args_3;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar9 [16];
  undefined1 local_4dc [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4d0;
  double local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  double local_498;
  double dStack_490;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined1 local_478 [16];
  double local_468;
  value_type local_458;
  vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_> *local_448;
  shared_ptr<material<double>_> *local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  string line;
  string op;
  stringstream lstream;
  ostream local_3b0 [376];
  ifstream file_;
  
  (this->super_hit<double>)._vptr_hit = (_func_int **)&PTR_is_hit_0010fce8;
  local_440 = m;
  std::__shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>,
             &m->super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>);
  std::ifstream::ifstream(&this->file_);
  (this->max_).e[1] = 0.0;
  (this->max_).e[2] = 0.0;
  (this->min_).e[2] = 0.0;
  (this->max_).e[0] = 0.0;
  (this->min_).e[0] = 0.0;
  (this->min_).e[1] = 0.0;
  (this->faces).super_hit<double>._vptr_hit = (_func_int **)&PTR_is_hit_0010f8d8;
  this_00 = &this->verts;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&file_,(string *)file,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&lstream);
  local_448 = &(this->faces).obj_list;
  ss.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ss.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ss.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478._8_8_ = 0x4024000000000000;
  local_478._0_8_ = 0x4024000000000000;
  local_468 = 0.0;
  local_488 = 0;
  uStack_484 = 0x40240000;
  local_498 = 0.0;
  dStack_490 = 0.0;
  auVar9 = local_478;
  while( true ) {
    local_478 = auVar9;
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file_,(string *)&line);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    std::operator<<(local_3b0,(string *)&line);
    std::operator>>((istream *)&lstream,(string *)&op);
    split<double>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_4dc + 4),&line,' ');
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&ss);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4dc + 4));
    auVar9 = local_478;
    if (*line._M_dataplus._M_p == 'f') {
      iVar2 = std::__cxx11::stoi(ss.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
      iVar3 = std::__cxx11::stoi(ss.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
      iVar4 = std::__cxx11::stoi(ss.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0,10);
      __args_1 = std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::at
                           (this_00,(long)(iVar2 + -1));
      __args_2 = std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::at
                           (this_00,(long)(iVar3 + -1));
      __args_3 = std::vector<vec3<double>,_std::allocator<vec3<double>_>_>::at
                           (this_00,(long)(iVar4 + -1));
      local_4dc._0_4_ = 0;
      std::
      make_shared<triangle<double>,vec3<double>&,vec3<double>&,vec3<double>&,int,std::shared_ptr<material<double>>&>
                ((vec3<double> *)(local_4dc + 4),__args_1,__args_2,(int *)__args_3,
                 (shared_ptr<material<double>_> *)local_4dc);
      local_458.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4dc._4_8_;
      local_458.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_4d0._M_pi;
      local_4dc._4_8_ = (element_type *)0x0;
      _Stack_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
      push_back(local_448,&local_458);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_458.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4d0);
    }
    else if (*line._M_dataplus._M_p == 'v') {
      dVar1 = std::__cxx11::stod(ss.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
      local_428._8_4_ = extraout_XMM0_Dc;
      local_428._0_8_ = dVar1;
      local_428._12_4_ = extraout_XMM0_Dd;
      dVar1 = std::__cxx11::stod(ss.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0);
      local_438._8_4_ = extraout_XMM0_Dc_00;
      local_438._0_8_ = dVar1;
      local_438._12_4_ = extraout_XMM0_Dd_00;
      dVar1 = std::__cxx11::stod(ss.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0);
      local_4dc._4_8_ = local_428._0_8_;
      _Stack_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._0_8_;
      local_4c8 = dVar1;
      std::vector<vec3<double>,std::allocator<vec3<double>>>::emplace_back<vec3<double>>
                ((vector<vec3<double>,std::allocator<vec3<double>>> *)this_00,
                 (vec3<double> *)(local_4dc + 4));
      uVar7 = SUB84(dVar1,0);
      uVar8 = (int)((ulong)dVar1 >> 0x20);
      if ((double)CONCAT44(uStack_484,local_488) <= dVar1) {
        uVar7 = local_488;
        uVar8 = uStack_484;
      }
      auVar9._8_8_ = local_438._0_8_;
      auVar9._0_8_ = local_428._0_8_;
      auVar9 = minpd(auVar9,local_478);
      uVar6 = -(ulong)((double)CONCAT44(uStack_484,local_488) < dVar1);
      local_468 = (double)(~uVar6 & (ulong)local_468 | uVar6 & (ulong)dVar1);
      local_498 = (double)(~-(ulong)((double)local_478._0_8_ < (double)local_428._0_8_) &
                           (ulong)local_498 |
                          local_428._0_8_ &
                          -(ulong)((double)local_478._0_8_ < (double)local_428._0_8_));
      dStack_490 = (double)(~-(ulong)((double)local_478._8_8_ < (double)local_438._0_8_) &
                            (ulong)dStack_490 |
                           local_438._0_8_ &
                           -(ulong)((double)local_478._8_8_ < (double)local_438._0_8_));
      local_488 = uVar7;
      uStack_484 = uVar8;
    }
  }
  (this->min_).e[0] = (double)local_478._0_8_;
  (this->min_).e[1] = (double)local_478._8_8_;
  (this->min_).e[2] = (double)CONCAT44(uStack_484,local_488);
  (this->max_).e[0] = local_498;
  (this->max_).e[1] = dStack_490;
  (this->max_).e[2] = local_468;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ss);
  std::__cxx11::stringstream::~stringstream((stringstream *)&lstream);
  std::__cxx11::string::~string((string *)&op);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&file_);
  return;
}

Assistant:

mesh<T>::mesh(const std::string& file, std::shared_ptr<material<T>> m) : m_(m) {
  std::ifstream file_(file);
  std::string line, op;
  std::stringstream lstream;
  std::vector<std::string> ss;

  vec3<T> temp_pos;
  T x, y, z;
  int count{0};
  int i = 0;
  T minx(10), miny(10), minz(10);
  T maxx(0), maxy(0), maxz(0);
  while (std::getline(file_, line)) {
    lstream << line;
    lstream >> op;
    ss = split<T>(line, ' ');
    // std::cerr << ss[0] << "\n";
    if (line[0] == 'v') {
      // std::cerr << "PRINT \n";
      // lstream >> x >> y >> z;
      x = std::stod(ss[1]);
      y = std::stod(ss[2]);
      z = std::stod(ss[3]);
      if (x > minx)
        maxx = x;
      if (y > miny)
        maxy = y;
      if (z > minz)
        maxz = z;
      if (x < minx)
        minx = x;
      if (y < miny)
        miny = y;
      if (z < minz)
        minz = z;

      point3<T> temp_vert(x, y, z);
      verts.push_back(1.0 * temp_vert);
    } else if (line[0] == 'f') {
      int v0, v1, v2;
      v0 = std::stoi(ss[1]);
      v1 = std::stoi(ss[2]);
      v2 = std::stoi(ss[3]);
      // lstream >> v0 >> v1 >> v2;
      faces.add(std::make_shared<triangle<T>>(
          verts.at(v0 - 1), verts.at(v1 - 1), verts.at(v2 - 1), 0, m));
    }
  }
  min_ = point3<T>(minx, miny, minz);
  max_ = point3<T>(maxx, maxy, maxz);
}